

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 local_d8 [8];
  xdg_paths state_2;
  char *path_2;
  char *paths_1 [1];
  undefined1 local_a8 [4];
  int i_1;
  xdg_paths state_1;
  char *path_1;
  char *paths [3];
  int local_64;
  int i;
  char *ret_3;
  char *home_1;
  char *ret_2;
  char *ret_1;
  char *home;
  xdg_paths state;
  char *path;
  char *ret;
  
  pvVar2 = (void *)xdg_get_path("XDG_CONFIG_HOME",".config");
  printf("%s\n");
  free(pvVar2);
  pvVar2 = (void *)xdg_get_path("XDG_DATA_HOME",".local/share");
  printf("%s\n");
  free(pvVar2);
  pvVar2 = (void *)xdg_get_path("XDG_CACHE_HOME",".cache");
  printf("%s\n");
  free(pvVar2);
  pvVar2 = (void *)xdg_get_path("XDG_THIS_DOES_NOT_EXIST","but_mah_path_is_still_here");
  printf("%s\n");
  free(pvVar2);
  memset(&home,0,0x18);
  while( true ) {
    state._16_8_ = xdg_get_paths("XDG_DATA_DIRS",
                                 "/usr/share:/foo/bar:asd:/the/relative/got/skipped:asd",&home,
                                 0xffffffff);
    if (state._16_8_ == 0) break;
    printf("=> %s\n",state._16_8_);
  }
  setenv("XDG_CONFIG_HOME","/home/dir/.configs",1);
  pcVar3 = (char *)xdg_get_path("XDG_CONFIG_HOME","default_is_not_used");
  iVar1 = strcmp(pcVar3,"/home/dir/.configs");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(ret, home)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x1f,"int main(void)");
  }
  free(pcVar3);
  unsetenv("XDG_CONFIG_HOME");
  pcVar3 = (char *)xdg_get_path("XDG_CONFIG_HOME","default_path");
  pcVar4 = strstr(pcVar3,"default_path");
  if (pcVar4 == (char *)0x0) {
    __assert_fail("strstr(ret, \"default_path\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x27,"int main(void)");
  }
  free(pcVar3);
  setenv("XDG_CONFIG_HOME",anon_var_dwarf_1a2,1);
  pcVar3 = (char *)xdg_get_path("XDG_CONFIG_HOME","that_does_not_get_set");
  iVar1 = strcmp(pcVar3,anon_var_dwarf_1a2);
  if (iVar1 == 0) {
    __assert_fail("strcmp(ret, home)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x30,"int main(void)");
  }
  free(pcVar3);
  local_64 = 0;
  paths[0] = "/test2";
  paths[1] = "/relative/skipped";
  setenv("XDG_DATA_DIRS","/test:/test2:relative:/relative/skipped:/ignored/by/max/iter/arg",1);
  memset(local_a8,0,0x18);
  while( true ) {
    state_1._16_8_ = xdg_get_paths("XDG_DATA_DIRS","/does:/not:/trigger",local_a8,3);
    if ((char *)state_1._16_8_ == (char *)0x0) break;
    if (2 < local_64) {
LAB_001014da:
      __assert_fail("i < 3 && !strcmp(path, paths[i])",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                    ,0x3d,"int main(void)");
    }
    iVar1 = strcmp((char *)state_1._16_8_,paths[(long)local_64 + -1]);
    if (iVar1 != 0) goto LAB_001014da;
    local_64 = local_64 + 1;
  }
  paths_1[0]._4_4_ = 0;
  unsetenv("XDG_DATA_DIRS");
  memset(local_d8,0,0x18);
  while( true ) {
    state_2._16_8_ = xdg_get_paths("XDG_DATA_DIRS","/default:relative:skip/path",local_d8,1);
    if ((char *)state_2._16_8_ == (char *)0x0) {
      return 0;
    }
    if (0 < paths_1[0]._4_4_) break;
    iVar1 = strcmp((char *)state_2._16_8_,paths_1[(long)paths_1[0]._4_4_ + -1]);
    if (iVar1 != 0) break;
    paths_1[0]._4_4_ = paths_1[0]._4_4_ + 1;
  }
  __assert_fail("i < 1 && !strcmp(path, paths[i])",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c",
                0x4b,"int main(void)");
}

Assistant:

int
main(void)
{
   // OUTPUT: current variables
   {
      char *ret;
      printf("%s\n", (ret = xdg_get_path("XDG_CONFIG_HOME", ".config"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_DATA_HOME", ".local/share"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_CACHE_HOME", ".cache"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_THIS_DOES_NOT_EXIST", "but_mah_path_is_still_here"))); free(ret);

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/usr/share:/foo/bar:asd:/the/relative/got/skipped:asd", &state, -1)))
         printf("=> %s\n", path);
   }

   // TEST: good set
   {
      const char *home = "/home/dir/.configs" ;
      setenv("XDG_CONFIG_HOME", home, 1);
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "default_is_not_used");
      assert(!strcmp(ret, home));
      free(ret);
   }

   // TEST: default value
   {
      unsetenv("XDG_CONFIG_HOME");
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "default_path");
      assert(strstr(ret, "default_path"));
      free(ret);
   }

   // TEST: non relative
   {
      const char *home = "\\o// $24$@£ DID I SET MY CONFIG_HOME RIGHT!?" ;
      setenv("XDG_CONFIG_HOME", home, 1);
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "that_does_not_get_set");
      assert(strcmp(ret, home));
      free(ret);
   }

   // TEST: good paths
   {
      int i = 0;
      const char *paths[3] = { "/test", "/test2", "/relative/skipped" };
      setenv("XDG_DATA_DIRS", "/test:/test2:relative:/relative/skipped:/ignored/by/max/iter/arg", 1);

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/does:/not:/trigger", &state, 3))) {
         assert(i < 3 && !strcmp(path, paths[i]));
         ++i;
      }
   }

   // TEST: default paths
   {
      int i = 0;
      const char *paths[1] = { "/default" };
      unsetenv("XDG_DATA_DIRS");

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/default:relative:skip/path", &state, 1))) {
         assert(i < 1 && !strcmp(path, paths[i]));
         ++i;
      }
   }

   return EXIT_SUCCESS;
}